

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     Combine<duckdb::ArgMinMaxState<long,int>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (Vector *source,Vector *target,AggregateInputData *aggr_input_data,idx_t count)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  idx_t iVar5;
  
  if (count != 0) {
    lVar1 = *(long *)(source + 0x20);
    lVar2 = *(long *)(target + 0x20);
    iVar5 = 0;
    do {
      pcVar3 = *(char **)(lVar1 + iVar5 * 8);
      if ((*pcVar3 == '\x01') &&
         ((pcVar4 = *(char **)(lVar2 + iVar5 * 8), *pcVar4 != '\x01' ||
          (*(int *)(pcVar4 + 0x10) < *(int *)(pcVar3 + 0x10))))) {
        *(undefined8 *)(pcVar4 + 8) = *(undefined8 *)(pcVar3 + 8);
        *(undefined4 *)(pcVar4 + 0x10) = *(undefined4 *)(pcVar3 + 0x10);
        *pcVar4 = '\x01';
      }
      iVar5 = iVar5 + 1;
    } while (count != iVar5);
  }
  return;
}

Assistant:

static void Combine(Vector &source, Vector &target, AggregateInputData &aggr_input_data, idx_t count) {
		D_ASSERT(source.GetType().id() == LogicalTypeId::POINTER && target.GetType().id() == LogicalTypeId::POINTER);
		auto sdata = FlatVector::GetData<const STATE_TYPE *>(source);
		auto tdata = FlatVector::GetData<STATE_TYPE *>(target);

		for (idx_t i = 0; i < count; i++) {
			OP::template Combine<STATE_TYPE, OP>(*sdata[i], *tdata[i], aggr_input_data);
		}
	}